

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 __thiscall absl::lts_20250127::operator<<(lts_20250127 *this,uint128 lhs,int amount)

{
  ulong uVar1;
  undefined1 v [16];
  unsigned___int128 *puVar2;
  ulong uVar3;
  ulong uVar4;
  long extraout_RDX;
  byte local_2c;
  lts_20250127 *plStack_28;
  int amount_local;
  uint128 lhs_local;
  
  lhs_local.lo_ = lhs.lo_;
  plStack_28 = this;
  puVar2 = uint128::operator_cast_to_unsigned___int128
                     ((unsigned___int128 *)&stack0xffffffffffffffd8,(uint128 *)lhs_local.lo_);
  local_2c = (byte)lhs.hi_;
  uVar3 = (long)puVar2 << (local_2c & 0x3f);
  uVar4 = uVar3;
  uVar1 = extraout_RDX << (local_2c & 0x3f) | (ulong)puVar2 >> 0x40 - (local_2c & 0x3f);
  if (((undefined1  [16])lhs & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
    uVar4 = 0;
    uVar1 = uVar3;
  }
  v._8_8_ = uVar1;
  v._0_8_ = uVar4;
  uint128::uint128((uint128 *)&lhs_local.hi_,(unsigned___int128)v);
  return stack0xffffffffffffffe8;
}

Assistant:

constexpr uint128 operator<<(uint128 lhs, int amount) {
#ifdef ABSL_HAVE_INTRINSIC_INT128
  return static_cast<unsigned __int128>(lhs) << amount;
#else
  // uint64_t shifts of >= 64 are undefined, so we will need some
  // special-casing.
  return amount >= 64  ? MakeUint128(Uint128Low64(lhs) << (amount - 64), 0)
         : amount == 0 ? lhs
                       : MakeUint128((Uint128High64(lhs) << amount) |
                                         (Uint128Low64(lhs) >> (64 - amount)),
                                     Uint128Low64(lhs) << amount);
#endif
}